

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O2

bool crnlib::command_line_params::load_string_file(char *pFilename,dynamic_string_array *strings)

{
  bool bVar1;
  int iVar2;
  char *p;
  dynamic_string ansi_str;
  dynamic_string local_80;
  cfile_stream in_stream;
  
  cfile_stream::cfile_stream(&in_stream);
  iVar2 = cfile_stream::open(&in_stream,pFilename,5,0);
  if (SUB41(iVar2,0) == false) {
    console::error("Unable to open file \"%s\" for reading!",pFilename);
  }
  else {
    ansi_str.m_buf_size = 0;
    ansi_str.m_len = 0;
    ansi_str.m_pStr = (char *)0x0;
    while( true ) {
      bVar1 = data_stream::read_line(&in_stream.super_data_stream,&ansi_str);
      if (!bVar1) break;
      dynamic_string::trim(&ansi_str);
      if (ansi_str.m_len != 0) {
        p = ansi_str.m_pStr;
        if (ansi_str.m_pStr == (char *)0x0) {
          p = "";
        }
        dynamic_string::dynamic_string(&local_80,p);
        vector<crnlib::dynamic_string>::push_back(strings,&local_80);
        dynamic_string::~dynamic_string(&local_80);
      }
    }
    dynamic_string::~dynamic_string(&ansi_str);
  }
  cfile_stream::~cfile_stream(&in_stream);
  return SUB41(iVar2,0);
}

Assistant:

bool command_line_params::load_string_file(const char* pFilename, dynamic_string_array& strings)
    {
        cfile_stream in_stream;
        if (!in_stream.open(pFilename, cDataStreamReadable | cDataStreamSeekable))
        {
            console::error("Unable to open file \"%s\" for reading!", pFilename);
            return false;
        }

        dynamic_string ansi_str;

        for (;;)
        {
            if (!in_stream.read_line(ansi_str))
            {
                break;
            }
            ansi_str.trim();
            if (ansi_str.is_empty())
            {
                continue;
            }
            strings.push_back(dynamic_string(ansi_str.get_ptr()));
        }

        return true;
    }